

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O3

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::hard_decision<bool>
          (RateAdaptiveCode<unsigned_int> *this,vector<bool,_std::allocator<bool>_> *out,
          vector<double,_std::allocator<double>_> *llrs,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_c)

{
  uint uVar1;
  ulong *puVar2;
  ulong *puVar3;
  pointer pdVar4;
  pointer pvVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  double *pdVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  
  puVar2 = (out->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar3 = (out->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (out->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (puVar2 != puVar3 || uVar1 != 0) {
    uVar7 = 0;
    puVar10 = puVar2;
    do {
      bVar6 = (byte)uVar7 & 0x3f;
      *puVar10 = *puVar10 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      bVar13 = uVar7 == 0x3f;
      uVar7 = uVar7 + 1;
      if (bVar13) {
        uVar7 = 0;
      }
      puVar10 = puVar10 + bVar13;
    } while (uVar7 != uVar1 || puVar10 != puVar3);
  }
  pdVar4 = (llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    pvVar5 = (msg_c->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      dVar14 = pdVar4[uVar8];
      for (pdVar11 = pvVar5[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar11 !=
          *(pointer *)
           ((long)&pvVar5[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8); pdVar11 = pdVar11 + 1) {
        dVar14 = dVar14 + *pdVar11;
      }
      if (dVar14 < 0.0) {
        uVar12 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar12 = uVar8;
        }
        puVar2[((long)uVar12 >> 6) +
               ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             puVar2[((long)uVar12 >> 6) +
                    ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)uVar8 & 0x3f);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != lVar9 + (ulong)(lVar9 == 0));
  }
  return;
}

Assistant:

void hard_decision(
                std::vector<Bit> &out,
                const std::vector<double> &llrs,
                const std::vector<std::vector<double>> &msg_c) const {
            std::fill(out.begin(), out.end(), 0);
            for (std::size_t j{}; j < llrs.size(); ++j) {
                const double curr_sum = std::accumulate(msg_c[j].begin(), msg_c[j].end(), llrs[j]);
                if (curr_sum < 0) {
                    out[j] = 1;
                }
            }
        }